

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndirectTest.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::IndirectDraw::iterate
          (TestStatus *__return_storage_ptr__,IndirectDraw *this)

{
  VkPrimitiveTopology VVar1;
  DeviceInterface *pDVar2;
  VkCommandBuffer_s *pVVar3;
  VkOffset3D offset;
  qpTestResult code;
  undefined8 uVar4;
  bool bVar5;
  VkResult VVar6;
  int iVar7;
  int iVar8;
  TestContext *this_00;
  TestLog *log_00;
  TestError *pTVar9;
  Buffer *pBVar10;
  VkCommandBuffer_s **ppVVar11;
  VkDevice pVVar12;
  Allocator *pAVar13;
  void *pvVar14;
  reference src;
  VkDeviceSize offset_00;
  Handle<(vk::HandleType)18> *pHVar15;
  VkBuffer VVar16;
  PixelBufferAccess *pPVar17;
  Image *this_01;
  ConstPixelBufferAccess *reference;
  char *__s;
  SharedPtr<vkt::Draw::Buffer> *this_02;
  Move<vk::VkCommandBuffer_s_*> *this_03;
  float fVar18;
  float fVar19;
  allocator<char> local_3b1;
  string local_3b0;
  qpTestResult local_38c;
  void *pvStack_388;
  qpTestResult res;
  deInt32 local_380;
  undefined1 local_378 [8];
  ConstPixelBufferAccess renderedFrame;
  VkOffset3D zeroOffset;
  int local_32c;
  float xCoord;
  int x;
  float yCoord;
  int y;
  ReferenceImageCoordinates refCoords;
  deInt32 frameHeight;
  deInt32 frameWidth;
  undefined1 local_2e0 [8];
  Texture2D referenceFrame;
  undefined8 uStack_288;
  VkSubmitInfo submitInfo;
  uint local_22c;
  deUint32 drawNdx;
  Allocation local_208;
  Allocation local_1e8;
  VkDeviceMemory local_1c8;
  Allocation local_1c0;
  void *local_1a0;
  deUint8 *ptr;
  BufferCreateInfo local_190;
  undefined1 local_140 [24];
  VkDeviceSize dataSize;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  VkDrawIndexedIndirectCommand drawCommands_3 [3];
  VkDrawIndexedIndirectCommand drawCommands_2 [3];
  undefined1 local_88 [8];
  VkDrawIndirectCommand drawCommands_1 [3];
  VkDrawIndirectCommand drawCommands [3];
  VkQueue queue;
  TestLog *log;
  IndirectDraw *this_local;
  
  this_00 = Context::getTestContext((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  log_00 = tcu::TestContext::getLog(this_00);
  drawCommands[2]._8_8_ =
       Context::getUniversalQueue((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  if (this->m_drawType == DRAW_TYPE_SEQUENTIAL) {
    VVar1 = (this->super_DrawTestsBaseClass).m_topology;
    if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
      memcpy(&drawCommands_1[2].firstVertex,&DAT_01328fd0,0x30);
      addCommand<vk::VkDrawIndirectCommand>
                (this,(VkDrawIndirectCommand *)&drawCommands_1[2].firstVertex);
      addCommand<vk::VkDrawIndirectCommand>
                (this,(VkDrawIndirectCommand *)&drawCommands[0].firstVertex);
      addCommand<vk::VkDrawIndirectCommand>
                (this,(VkDrawIndirectCommand *)&drawCommands[1].firstVertex);
    }
    else {
      if (VVar1 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x111);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      memcpy(local_88,&DAT_01329000,0x30);
      addCommand<vk::VkDrawIndirectCommand>(this,(VkDrawIndirectCommand *)local_88);
      addCommand<vk::VkDrawIndirectCommand>
                (this,(VkDrawIndirectCommand *)&drawCommands_1[0].firstVertex);
      addCommand<vk::VkDrawIndirectCommand>
                (this,(VkDrawIndirectCommand *)&drawCommands_1[1].firstVertex);
    }
    this->m_strideInBuffer = 0x20;
  }
  else if (this->m_drawType == DRAW_TYPE_INDEXED) {
    VVar1 = (this->super_DrawTestsBaseClass).m_topology;
    if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
      memcpy(&drawCommands_3[2].firstInstance,&DAT_01329030,0x3c);
      addCommand<vk::VkDrawIndexedIndirectCommand>
                (this,(VkDrawIndexedIndirectCommand *)&drawCommands_3[2].firstInstance);
      addCommand<vk::VkDrawIndexedIndirectCommand>
                (this,(VkDrawIndexedIndirectCommand *)&drawCommands_2[0].vertexOffset);
      addCommand<vk::VkDrawIndexedIndirectCommand>
                (this,(VkDrawIndexedIndirectCommand *)&drawCommands_2[1].vertexOffset);
    }
    else {
      if (VVar1 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x14d);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      memcpy(&vertexBufferOffset,&DAT_01329070,0x3c);
      addCommand<vk::VkDrawIndexedIndirectCommand>
                (this,(VkDrawIndexedIndirectCommand *)&vertexBufferOffset);
      addCommand<vk::VkDrawIndexedIndirectCommand>
                (this,(VkDrawIndexedIndirectCommand *)&drawCommands_3[0].vertexOffset);
      addCommand<vk::VkDrawIndexedIndirectCommand>
                (this,(VkDrawIndexedIndirectCommand *)&drawCommands_3[1].vertexOffset);
    }
    this->m_strideInBuffer = 0x28;
  }
  this->m_drawCount = 2;
  this->m_offsetInBuffer = 8;
  DrawTestsBaseClass::beginRenderPass(&this->super_DrawTestsBaseClass);
  vertexBuffer.m_internal = 0;
  pBVar10 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                      (&(this->super_DrawTestsBaseClass).m_vertexBuffer);
  dataSize = (VkDeviceSize)Draw::Buffer::object(pBVar10);
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_DrawTestsBaseClass).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x58])(pDVar2,*ppVVar11,0,1,&dataSize,&vertexBuffer);
  local_140._16_8_ = std::vector<char,_std::allocator<char>_>::size(&this->m_indirectBufferContents)
  ;
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  pVVar12 = Context::getDevice((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  BufferCreateInfo::BufferCreateInfo
            (&local_190,local_140._16_8_ + this->m_offsetInBuffer,0x100,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0);
  pAVar13 = Context::getDefaultAllocator
                      ((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  ptr._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  Draw::Buffer::createAndAlloc
            ((Buffer *)local_140,pDVar2,pVVar12,&local_190.super_VkBufferCreateInfo,pAVar13,
             ::vk::MemoryRequirement::HostVisible);
  de::SharedPtr<vkt::Draw::Buffer>::operator=
            (&this->m_indirectBuffer,(SharedPtr<vkt::Draw::Buffer> *)local_140);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr((SharedPtr<vkt::Draw::Buffer> *)local_140);
  BufferCreateInfo::~BufferCreateInfo(&local_190);
  this_02 = &this->m_indirectBuffer;
  pBVar10 = de::SharedPtr<vkt::Draw::Buffer>::operator->(this_02);
  Draw::Buffer::getBoundMemory(&local_1c0,pBVar10);
  pvVar14 = ::vk::Allocation::getHostPtr(&local_1c0);
  ::vk::Allocation::~Allocation(&local_1c0);
  local_1a0 = pvVar14;
  ::deMemcpy(pvVar14,&this->m_junkData,this->m_offsetInBuffer);
  pvVar14 = (void *)((long)local_1a0 + this->m_offsetInBuffer);
  src = std::vector<char,_std::allocator<char>_>::operator[](&this->m_indirectBufferContents,0);
  ::deMemcpy(pvVar14,src,local_140._16_8_);
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  pVVar12 = Context::getDevice((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  pBVar10 = de::SharedPtr<vkt::Draw::Buffer>::operator->(this_02);
  Draw::Buffer::getBoundMemory(&local_1e8,pBVar10);
  local_1c8 = ::vk::Allocation::getMemory(&local_1e8);
  pBVar10 = de::SharedPtr<vkt::Draw::Buffer>::operator->(this_02);
  Draw::Buffer::getBoundMemory(&local_208,pBVar10);
  offset_00 = ::vk::Allocation::getOffset(&local_208);
  ::vk::flushMappedMemoryRange
            (pDVar2,pVVar12,local_1c8,offset_00,local_140._16_8_ + this->m_offsetInBuffer);
  ::vk::Allocation::~Allocation(&local_208);
  ::vk::Allocation::~Allocation(&local_1e8);
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_DrawTestsBaseClass).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar3 = *ppVVar11;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      (&(this->super_DrawTestsBaseClass).m_pipeline.
                        super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*pDVar2->_vptr_DeviceInterface[0x4c])(pDVar2,pVVar3,0,pHVar15->m_internal);
  if (this->m_drawType == DRAW_TYPE_INDEXED) {
    pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
    ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         (&(this->super_DrawTestsBaseClass).m_cmdBuffer.
                           super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar3 = *ppVVar11;
    pBVar10 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_indexBuffer);
    VVar16 = Draw::Buffer::object(pBVar10);
    (*pDVar2->_vptr_DeviceInterface[0x57])(pDVar2,pVVar3,VVar16.m_internal,0,1);
  }
  if ((this->m_isMultiDrawEnabled == 0) || (this->m_drawIndirectMaxCount < this->m_drawCount)) {
    for (local_22c = 0; local_22c < this->m_drawCount; local_22c = local_22c + 1) {
      if (this->m_drawType == DRAW_TYPE_SEQUENTIAL) {
        pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
        ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                             (&(this->super_DrawTestsBaseClass).m_cmdBuffer.
                               super_RefBase<vk::VkCommandBuffer_s_*>);
        pVVar3 = *ppVVar11;
        pBVar10 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_indirectBuffer);
        VVar16 = Draw::Buffer::object(pBVar10);
        (*pDVar2->_vptr_DeviceInterface[0x5b])
                  (pDVar2,pVVar3,VVar16.m_internal,
                   this->m_offsetInBuffer + (ulong)(local_22c * this->m_strideInBuffer),1,0);
      }
      else {
        if (this->m_drawType != DRAW_TYPE_INDEXED) {
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,"impossible",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                     ,0x193);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
        ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                             (&(this->super_DrawTestsBaseClass).m_cmdBuffer.
                               super_RefBase<vk::VkCommandBuffer_s_*>);
        pVVar3 = *ppVVar11;
        pBVar10 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_indirectBuffer);
        submitInfo.pSignalSemaphores = (VkSemaphore *)Draw::Buffer::object(pBVar10);
        (*pDVar2->_vptr_DeviceInterface[0x5c])
                  (pDVar2,pVVar3,submitInfo.pSignalSemaphores,
                   this->m_offsetInBuffer + (ulong)(local_22c * this->m_strideInBuffer),1);
      }
    }
  }
  else if (this->m_drawType == DRAW_TYPE_SEQUENTIAL) {
    pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
    ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         (&(this->super_DrawTestsBaseClass).m_cmdBuffer.
                           super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar3 = *ppVVar11;
    pBVar10 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_indirectBuffer);
    VVar16 = Draw::Buffer::object(pBVar10);
    (*pDVar2->_vptr_DeviceInterface[0x5b])
              (pDVar2,pVVar3,VVar16.m_internal,this->m_offsetInBuffer,(ulong)this->m_drawCount,
               (ulong)this->m_strideInBuffer);
  }
  else {
    if (this->m_drawType != DRAW_TYPE_INDEXED) {
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"impossible",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                 ,0x183);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
    ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         (&(this->super_DrawTestsBaseClass).m_cmdBuffer.
                           super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar3 = *ppVVar11;
    pBVar10 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_indirectBuffer);
    VVar16 = Draw::Buffer::object(pBVar10);
    (*pDVar2->_vptr_DeviceInterface[0x5c])
              (pDVar2,pVVar3,VVar16.m_internal,this->m_offsetInBuffer,(ulong)this->m_drawCount,
               (ulong)this->m_strideInBuffer);
  }
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  this_03 = &(this->super_DrawTestsBaseClass).m_cmdBuffer;
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x76])(pDVar2,*ppVVar11);
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x4a])(pDVar2,*ppVVar11);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_288 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  uVar4 = drawCommands[2]._8_8_;
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle
            ((Handle<(vk::HandleType)6> *)&referenceFrame.m_view.m_levels,0);
  VVar6 = (*pDVar2->_vptr_DeviceInterface[2])(pDVar2,uVar4,1,&uStack_288);
  ::vk::checkResult(VVar6,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                    ,0x1a6);
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  VVar6 = (*pDVar2->_vptr_DeviceInterface[3])(pDVar2,drawCommands[2]._8_8_);
  ::vk::checkResult(VVar6,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                    ,0x1a8);
  _frameHeight = ::vk::mapVkFormat((this->super_DrawTestsBaseClass).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D((Texture2D *)local_2e0,(TextureFormat *)&frameHeight,0x100,0x100);
  tcu::Texture2D::allocLevel((Texture2D *)local_2e0,0);
  iVar7 = tcu::Texture2D::getWidth((Texture2D *)local_2e0);
  iVar8 = tcu::Texture2D::getHeight((Texture2D *)local_2e0);
  pPVar17 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_2e0,0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&refCoords.bottom,0.0,0.0,0.0,1.0);
  tcu::clear(pPVar17,(Vec4 *)&refCoords.bottom);
  ReferenceImageCoordinates::ReferenceImageCoordinates((ReferenceImageCoordinates *)&yCoord);
  for (x = 0; x < iVar8; x = x + 1) {
    fVar18 = (float)x / ((float)iVar8 * 0.5) - 1.0;
    for (local_32c = 0; local_32c < iVar7; local_32c = local_32c + 1) {
      fVar19 = (float)local_32c / ((float)iVar7 * 0.5) - 1.0;
      if ((((refCoords.top <= (double)fVar18) && ((double)fVar18 <= refCoords.right)) &&
          (_yCoord <= (double)fVar19)) && ((double)fVar19 <= refCoords.left)) {
        pPVar17 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_2e0,0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&zeroOffset.z,0.0,0.0,1.0,1.0);
        tcu::PixelBufferAccess::setPixel(pPVar17,(Vec4 *)&zeroOffset.z,local_32c,x,0);
      }
    }
  }
  zeroOffset.x = 0;
  renderedFrame.m_data = (void *)0x0;
  this_01 = de::SharedPtr<vkt::Draw::Image>::operator->
                      (&(this->super_DrawTestsBaseClass).m_colorTargetImage);
  uVar4 = drawCommands[2]._8_8_;
  pAVar13 = Context::getDefaultAllocator
                      ((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  local_380 = zeroOffset.x;
  pvStack_388 = renderedFrame.m_data;
  offset.z = zeroOffset.x;
  offset._0_8_ = renderedFrame.m_data;
  Draw::Image::readSurface
            ((ConstPixelBufferAccess *)local_378,this_01,(VkQueue)uVar4,pAVar13,
             VK_IMAGE_LAYOUT_GENERAL,offset,0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  local_38c = QP_TEST_RESULT_PASS;
  reference = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_2e0,0)->
               super_ConstPixelBufferAccess;
  bVar5 = tcu::fuzzyCompare(log_00,"Result","Image comparison result",reference,
                            (ConstPixelBufferAccess *)local_378,0.05,COMPARE_LOG_RESULT);
  if (!bVar5) {
    local_38c = QP_TEST_RESULT_FAIL;
  }
  code = local_38c;
  __s = qpGetTestResultName(local_38c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,__s,&local_3b1);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  tcu::Texture2D::~Texture2D((Texture2D *)local_2e0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus IndirectDraw::iterate (void)
{
	tcu::TestLog &log = m_context.getTestContext().getLog();
	const vk::VkQueue queue = m_context.getUniversalQueue();

	if (m_drawType == DRAW_TYPE_SEQUENTIAL)
	{
		switch (m_topology)
		{
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
		{
			vk::VkDrawIndirectCommand drawCommands[] =
			{
				{
					3,		//vertexCount
					1,		//instanceCount
					2,		//firstVertex
					0		//firstInstance
				},
				{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deUint32)-9 }, // junk (stride)
				{
					3,		//vertexCount
					1,		//instanceCount
					5,		//firstVertex
					0		//firstInstance
				}
			};
			addCommand(drawCommands[0]);
			addCommand(drawCommands[1]);
			addCommand(drawCommands[2]);
			break;
		}
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		{
			vk::VkDrawIndirectCommand drawCommands[] =
			{
				{
					4,		//vertexCount
					1,		//instanceCount
					2,		//firstVertex
					0		//firstInstance
				},
				{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deUint32)-9 }, // junk (stride)
				{
					4,		//vertexCount
					1,		//instanceCount
					6,		//firstVertex
					0		//firstInstance
				}
			};
			addCommand(drawCommands[0]);
			addCommand(drawCommands[1]);
			addCommand(drawCommands[2]);
			break;
		}
		default:
			TCU_FAIL("impossible");
		}

		m_strideInBuffer = 2 * (deUint32)sizeof(vk::VkDrawIndirectCommand);
	}
	else if (m_drawType == DRAW_TYPE_INDEXED)
	{
		switch (m_topology)
		{
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
		{
			vk::VkDrawIndexedIndirectCommand drawCommands[] =
			{
				{
					3,					// indexCount
					1,					// instanceCount
					2,					// firstIndex
					VERTEX_OFFSET,		// vertexOffset
					0,					// firstInstance
				},
				{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deInt32)9, (deUint32)-7 }, // junk (stride)
				{
					3,					// indexCount
					1,					// instanceCount
					5,					// firstIndex
					VERTEX_OFFSET,		// vertexOffset
					0,					// firstInstance
				}
			};
			addCommand(drawCommands[0]);
			addCommand(drawCommands[1]);
			addCommand(drawCommands[2]);
			break;
		}
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		{
			vk::VkDrawIndexedIndirectCommand drawCommands[] =
			{
				{
					4,				// indexCount
					1,				// instanceCount
					2,				// firstIndex
					VERTEX_OFFSET,	// vertexOffset
					0,				// firstInstance
				},
				{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deInt32)9, (deUint32)-7 }, // junk (stride)
				{
					4,				// indexCount
					1,				// instanceCount
					6,				// firstIndex
					VERTEX_OFFSET,	// vertexOffset
					0,				// firstInstance
				}
			};
			addCommand(drawCommands[0]);
			addCommand(drawCommands[1]);
			addCommand(drawCommands[2]);
			break;
		}
		default:
			TCU_FAIL("impossible");
		}

		m_strideInBuffer = 2 * (deUint32)sizeof(vk::VkDrawIndexedIndirectCommand);
	}

	m_drawCount			= 2;
	m_offsetInBuffer	= sizeof(m_junkData);

	beginRenderPass();

	const vk::VkDeviceSize vertexBufferOffset	= 0;
	const vk::VkBuffer vertexBuffer				= m_vertexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

	const vk::VkDeviceSize dataSize = m_indirectBufferContents.size();

	m_indirectBuffer = Buffer::createAndAlloc(	m_vk,
												m_context.getDevice(),
												BufferCreateInfo(dataSize + m_offsetInBuffer,
																 vk::VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT),
												m_context.getDefaultAllocator(),
												vk::MemoryRequirement::HostVisible);

	deUint8* ptr = reinterpret_cast<deUint8*>(m_indirectBuffer->getBoundMemory().getHostPtr());

	deMemcpy(ptr, &m_junkData, static_cast<size_t>(m_offsetInBuffer));
	deMemcpy(ptr + m_offsetInBuffer, &m_indirectBufferContents[0], static_cast<size_t>(dataSize));

	vk::flushMappedMemoryRange(m_vk,
							   m_context.getDevice(),
							   m_indirectBuffer->getBoundMemory().getMemory(),
							   m_indirectBuffer->getBoundMemory().getOffset(),
							   dataSize + m_offsetInBuffer);

	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	if (m_drawType == DRAW_TYPE_INDEXED)
	{
		m_vk.cmdBindIndexBuffer(*m_cmdBuffer, m_indexBuffer->object(), DE_NULL, vk::VK_INDEX_TYPE_UINT32);
	}

	if (m_isMultiDrawEnabled && m_drawCount <= m_drawIndirectMaxCount)
	{
		switch (m_drawType)
		{
			case DRAW_TYPE_SEQUENTIAL:
				m_vk.cmdDrawIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer, m_drawCount, m_strideInBuffer);
				break;
			case DRAW_TYPE_INDEXED:
				m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer, m_drawCount, m_strideInBuffer);
				break;
			default:
				TCU_FAIL("impossible");
		}
	}
	else
	{
		for (deUint32 drawNdx = 0; drawNdx < m_drawCount; drawNdx++)
		{
			switch (m_drawType)
			{
				case DRAW_TYPE_SEQUENTIAL:
					m_vk.cmdDrawIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer + drawNdx*m_strideInBuffer, 1u, 0u);
					break;
				case DRAW_TYPE_INDEXED:
					m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer + drawNdx*m_strideInBuffer, 1u, 0u);
					break;
				default:
					TCU_FAIL("impossible");
			}
		}
	}
	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,							// const void*				pNext;
		0,										// deUint32					waitSemaphoreCount;
		DE_NULL,								// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,										// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
		0,										// deUint32					signalSemaphoreCount;
		DE_NULL								// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	VK_CHECK(m_vk.queueWaitIdle(queue));

	// Validation
	tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
	referenceFrame.allocLevel(0);

	const deInt32 frameWidth	= referenceFrame.getWidth();
	const deInt32 frameHeight	= referenceFrame.getHeight();

	tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	ReferenceImageCoordinates refCoords;

	for (int y = 0; y < frameHeight; y++)
	{
		const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

		for (int x = 0; x < frameWidth; x++)
		{
			const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

			if ((yCoord >= refCoords.bottom	&&
				 yCoord <= refCoords.top	&&
				 xCoord >= refCoords.left	&&
				 xCoord <= refCoords.right))
				referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
		}
	}

	const vk::VkOffset3D zeroOffset					= { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
		referenceFrame.getLevel(0), renderedFrame, 0.05f,
		tcu::COMPARE_LOG_RESULT)) {
		res = QP_TEST_RESULT_FAIL;
	}

	return tcu::TestStatus(res, qpGetTestResultName(res));

}